

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall Array::~Array(Array *this)

{
  int **ppiVar1;
  int i;
  long lVar2;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  for (lVar2 = 0; ppiVar1 = this->_data, lVar2 < this->_height; lVar2 = lVar2 + 1) {
    if (ppiVar1[lVar2] != (int *)0x0) {
      operator_delete__(ppiVar1[lVar2]);
    }
  }
  if (ppiVar1 != (int **)0x0) {
    operator_delete__(ppiVar1);
    return;
  }
  return;
}

Assistant:

Array::~Array()
{
	for (int i = 0; i < _height; ++i) {
			delete[] _data[i];
	}

	delete[] _data;
}